

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void feature_limit(vw *all,example *ex)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  features *fs;
  features *this;
  
  pbVar2 = (ex->super_example_predict).indices._end;
  for (pbVar3 = (ex->super_example_predict).indices._begin; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    bVar1 = *pbVar3;
    if ((ulong)all->limit[bVar1] <
        (ulong)((long)(ex->super_example_predict).feature_space[bVar1].values._end -
                (long)(ex->super_example_predict).feature_space[bVar1].values._begin >> 2)) {
      this = (ex->super_example_predict).feature_space + bVar1;
      features::sort(this,all->parse_mask);
      unique_features(this,all->limit[bVar1]);
    }
  }
  return;
}

Assistant:

void feature_limit(vw& all, example* ex)
{
  for (namespace_index index : ex->indices)
    if (all.limit[index] < ex->feature_space[index].size())
    {
      features& fs = ex->feature_space[index];
      fs.sort(all.parse_mask);
      unique_features(fs, all.limit[index]);
    }
}